

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puff.cpp
# Opt level: O0

int dynamic(state *s)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_58c;
  int len;
  int symbol;
  huffman distcode;
  huffman lencode;
  short distsym [30];
  short distcnt [16];
  short lensym [286];
  short lencnt [16];
  short lengths [316];
  int local_28;
  int err;
  int index;
  int ncode;
  int ndist;
  int nlen;
  state *s_local;
  
  distcode.symbol = lensym + 0x11c;
  lencode.count = distcnt + 0xc;
  _len = distsym + 0x1c;
  distcode.count = (short *)&lencode.symbol;
  iVar2 = bits(s,5);
  iVar2 = iVar2 + 0x101;
  iVar3 = bits(s,5);
  iVar3 = iVar3 + 1;
  iVar4 = bits(s,4);
  if ((iVar2 < 0x11f) && (iVar3 < 0x1f)) {
    for (local_28 = 0; local_28 < iVar4 + 4; local_28 = local_28 + 1) {
      iVar5 = bits(s,3);
      lencnt[(long)dynamic::order[local_28] + 0xc] = (short)iVar5;
    }
    for (; local_28 < 0x13; local_28 = local_28 + 1) {
      lencnt[(long)dynamic::order[local_28] + 0xc] = 0;
    }
    iVar4 = construct((huffman *)&distcode.symbol,lencnt + 0xc,0x13);
    if (iVar4 == 0) {
      local_28 = 0;
      while (local_28 < iVar2 + iVar3) {
        iVar4 = decode(s,(huffman *)&distcode.symbol);
        if (iVar4 < 0) {
          return iVar4;
        }
        if (iVar4 < 0x10) {
          lencnt[(long)local_28 + 0xc] = (short)iVar4;
          local_28 = local_28 + 1;
        }
        else {
          sVar1 = 0;
          if (iVar4 == 0x10) {
            if (local_28 == 0) {
              return -5;
            }
            sVar1 = lencnt[(long)(local_28 + -1) + 0xc];
            local_58c = bits(s,2);
            local_58c = local_58c + 3;
          }
          else if (iVar4 == 0x11) {
            local_58c = bits(s,3);
            local_58c = local_58c + 3;
          }
          else {
            local_58c = bits(s,7);
            local_58c = local_58c + 0xb;
          }
          if (iVar2 + iVar3 < local_28 + local_58c) {
            return -6;
          }
          while (local_58c != 0) {
            lencnt[(long)local_28 + 0xc] = sVar1;
            local_58c = local_58c + -1;
            local_28 = local_28 + 1;
          }
        }
      }
      if (lengths[0xfc] == 0) {
        s_local._4_4_ = -9;
      }
      else {
        iVar4 = construct((huffman *)&distcode.symbol,lencnt + 0xc,iVar2);
        if ((iVar4 == 0) ||
           ((-1 < iVar4 && (iVar2 == (int)*distcode.symbol + (int)distcode.symbol[1])))) {
          iVar2 = construct((huffman *)&len,lencnt + (long)iVar2 + 0xc,iVar3);
          if ((iVar2 == 0) || ((-1 < iVar2 && (iVar3 == (int)*_len + (int)_len[1])))) {
            s_local._4_4_ = codes(s,(huffman *)&distcode.symbol,(huffman *)&len);
          }
          else {
            s_local._4_4_ = -8;
          }
        }
        else {
          s_local._4_4_ = -7;
        }
      }
    }
    else {
      s_local._4_4_ = -4;
    }
  }
  else {
    s_local._4_4_ = -3;
  }
  return s_local._4_4_;
}

Assistant:

local int dynamic(struct state *s)
{
    int nlen, ndist, ncode;             /* number of lengths in descriptor */
    int index;                          /* index of lengths[] */
    int err;                            /* construct() return value */
    short lengths[MAXCODES];            /* descriptor code lengths */
    short lencnt[MAXBITS+1], lensym[MAXLCODES];         /* lencode memory */
    short distcnt[MAXBITS+1], distsym[MAXDCODES];       /* distcode memory */
    struct huffman lencode, distcode;   /* length and distance codes */
    static const short order[19] =      /* permutation of code length codes */
        {16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15};

    /* construct lencode and distcode */
    lencode.count = lencnt;
    lencode.symbol = lensym;
    distcode.count = distcnt;
    distcode.symbol = distsym;

    /* get number of lengths in each table, check lengths */
    nlen = bits(s, 5) + 257;
    ndist = bits(s, 5) + 1;
    ncode = bits(s, 4) + 4;
    if (nlen > MAXLCODES || ndist > MAXDCODES)
        return -3;                      /* bad counts */

    /* read code length code lengths (really), missing lengths are zero */
    for (index = 0; index < ncode; index++)
        lengths[order[index]] = bits(s, 3);
    for (; index < 19; index++)
        lengths[order[index]] = 0;

    /* build huffman table for code lengths codes (use lencode temporarily) */
    err = construct(&lencode, lengths, 19);
    if (err != 0)               /* require complete code set here */
        return -4;

    /* read length/literal and distance code length tables */
    index = 0;
    while (index < nlen + ndist) {
        int symbol;             /* decoded value */

        symbol = decode(s, &lencode);
        if (symbol < 0)
            return symbol;          /* invalid symbol */
        if (symbol < 16)                /* length in 0..15 */
            lengths[index++] = symbol;
        else {                          /* repeat instruction */
            int len = 0;                /* last length to repeat */
                                        /* assume repeating zeros */
            if (symbol == 16) {         /* repeat last length 3..6 times */
                if (index == 0)
                    return -5;          /* no last length! */
                len = lengths[index - 1];       /* last length */
                symbol = 3 + bits(s, 2);
            }
            else if (symbol == 17)      /* repeat zero 3..10 times */
                symbol = 3 + bits(s, 3);
            else                        /* == 18, repeat zero 11..138 times */
                symbol = 11 + bits(s, 7);
            if (index + symbol > nlen + ndist)
                return -6;              /* too many lengths! */
            while (symbol--)            /* repeat last or zero symbol times */
                lengths[index++] = len;
        }
    }

    /* check for end-of-block code -- there better be one! */
    if (lengths[256] == 0)
        return -9;

    /* build huffman table for literal/length codes */
    err = construct(&lencode, lengths, nlen);
    if (err && (err < 0 || nlen != lencode.count[0] + lencode.count[1]))
        return -7;      /* incomplete code ok only for single length 1 code */

    /* build huffman table for distance codes */
    err = construct(&distcode, lengths + nlen, ndist);
    if (err && (err < 0 || ndist != distcode.count[0] + distcode.count[1]))
        return -8;      /* incomplete code ok only for single length 1 code */

    /* decode data until end-of-block code */
    return codes(s, &lencode, &distcode);
}